

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_crypt_cfb8
              (mbedtls_aes_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output)

{
  undefined8 uVar1;
  byte bVar2;
  byte unaff_BL;
  size_t sVar3;
  undefined7 uStack_47;
  undefined1 uStack_40;
  
  for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = *(undefined8 *)(iv + 8);
    uStack_47 = (undefined7)((ulong)*(undefined8 *)iv >> 8);
    uStack_40 = (undefined1)uVar1;
    mbedtls_aes_crypt_ecb(ctx,1,iv,iv);
    bVar2 = unaff_BL;
    if (mode == 0) {
      bVar2 = input[sVar3];
    }
    unaff_BL = *iv ^ input[sVar3];
    output[sVar3] = unaff_BL;
    if (mode != 1) {
      unaff_BL = bVar2;
    }
    *(undefined8 *)(iv + 7) = uVar1;
    *(ulong *)iv = CONCAT17(uStack_40,uStack_47);
    iv[0xf] = unaff_BL;
  }
  return 0;
}

Assistant:

int mbedtls_aes_crypt_cfb8( mbedtls_aes_context *ctx,
                            int mode,
                            size_t length,
                            unsigned char iv[16],
                            const unsigned char *input,
                            unsigned char *output )
{
    unsigned char c;
    unsigned char ov[17];

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( mode == MBEDTLS_AES_ENCRYPT ||
                      mode == MBEDTLS_AES_DECRYPT );
    AES_VALIDATE_RET( iv != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );
    while( length-- )
    {
        memcpy( ov, iv, 16 );
        mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );

        if( mode == MBEDTLS_AES_DECRYPT )
            ov[16] = *input;

        c = *output++ = (unsigned char)( iv[0] ^ *input++ );

        if( mode == MBEDTLS_AES_ENCRYPT )
            ov[16] = c;

        memcpy( iv, ov + 1, 16 );
    }

    return( 0 );
}